

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O3

void __thiscall
charls::process_transformed<charls::transform_none<unsigned_char>_>::decode_transform
          (process_transformed<charls::transform_none<unsigned_char>_> *this,void *source,
          void *destination,size_t pixel_count,size_t byte_stride)

{
  byte bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  short sVar4;
  int iVar5;
  interleave_mode iVar6;
  long lVar7;
  undefined1 *puVar8;
  size_t sVar9;
  size_t sVar10;
  undefined2 *puVar11;
  
  iVar5 = this->frame_info_->component_count;
  if (iVar5 == 4) {
    iVar6 = this->parameters_->interleave_mode;
    if (iVar6 == Line) {
      sVar9 = pixel_count;
      if (byte_stride < pixel_count) {
        sVar9 = byte_stride;
      }
      if (sVar9 != 0) {
        sVar10 = 0;
        do {
          *(uint *)((long)destination + sVar10 * 4) =
               CONCAT13(*(undefined1 *)((long)source + sVar10 + byte_stride * 3),
                        CONCAT12(*(undefined1 *)((long)source + sVar10 + byte_stride * 2),
                                 CONCAT11(*(undefined1 *)((long)source + sVar10 + byte_stride),
                                          *(undefined1 *)((long)source + sVar10))));
          sVar10 = sVar10 + 1;
        } while (sVar9 != sVar10);
      }
    }
    else if ((iVar6 == Sample) && (pixel_count != 0)) {
      sVar9 = 0;
      do {
        *(undefined4 *)((long)destination + sVar9 * 4) = *(undefined4 *)((long)source + sVar9 * 4);
        sVar9 = sVar9 + 1;
      } while (pixel_count != sVar9);
    }
  }
  else if (iVar5 == 3) {
    if (this->parameters_->interleave_mode == Sample) {
      if (pixel_count != 0) {
        lVar7 = 0;
        sVar9 = pixel_count;
        do {
          bVar1 = *(byte *)((long)source + lVar7);
          sVar4 = *(short *)((long)source + lVar7 + 1);
          *(char *)((long)destination + lVar7 + 2) = (char)((ushort)sVar4 >> 8);
          *(ushort *)((long)destination + lVar7) = sVar4 << 8 | (ushort)bVar1;
          lVar7 = lVar7 + 3;
          sVar9 = sVar9 - 1;
        } while (sVar9 != 0);
      }
    }
    else {
      sVar9 = pixel_count;
      if (byte_stride < pixel_count) {
        sVar9 = byte_stride;
      }
      if (sVar9 != 0) {
        sVar10 = 0;
        puVar11 = (undefined2 *)destination;
        do {
          uVar3 = *(undefined1 *)((long)source + sVar10);
          uVar2 = *(undefined1 *)((long)source + sVar10 + byte_stride);
          *(undefined1 *)(puVar11 + 1) = *(undefined1 *)((long)source + sVar10 + byte_stride * 2);
          *puVar11 = CONCAT11(uVar2,uVar3);
          sVar10 = sVar10 + 1;
          puVar11 = (undefined2 *)((long)puVar11 + 3);
        } while (sVar9 != sVar10);
      }
    }
  }
  if ((this->parameters_->output_bgr == true) && (pixel_count != 0)) {
    iVar5 = this->frame_info_->component_count;
    puVar8 = (undefined1 *)((long)destination + 2);
    do {
      uVar3 = puVar8[-2];
      puVar8[-2] = *puVar8;
      *puVar8 = uVar3;
      puVar8 = puVar8 + iVar5;
      pixel_count = pixel_count - 1;
    } while (pixel_count != 0);
  }
  return;
}

Assistant:

void decode_transform(const void* source, void* destination, const size_t pixel_count, const size_t byte_stride) noexcept
    {
        if (frame_info_.component_count == 3)
        {
            if (parameters_.interleave_mode == interleave_mode::sample)
            {
                transform_line(static_cast<triplet<size_type>*>(destination), static_cast<const triplet<size_type>*>(source),
                               pixel_count, inverse_transform_);
            }
            else
            {
                transform_line_to_triplet(static_cast<const size_type*>(source), byte_stride,
                                          static_cast<triplet<size_type>*>(destination), pixel_count, inverse_transform_);
            }
        }
        else if (frame_info_.component_count == 4)
        {
            if (parameters_.interleave_mode == interleave_mode::sample)
            {
                transform_line(static_cast<quad<size_type>*>(destination), static_cast<const quad<size_type>*>(source),
                               pixel_count, inverse_transform_);
            }
            else if (parameters_.interleave_mode == interleave_mode::line)
            {
                transform_line_to_quad(static_cast<const size_type*>(source), byte_stride,
                                       static_cast<quad<size_type>*>(destination), pixel_count, inverse_transform_);
            }
        }

        if (parameters_.output_bgr)
        {
            transform_rgb_to_bgr(static_cast<size_type*>(destination), frame_info_.component_count, pixel_count);
        }
    }